

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdh(secp256k1_context *ctx,uchar *output,secp256k1_pubkey *point,uchar *scalar,
                  secp256k1_ecdh_hash_function hashfp,void *data)

{
  uint uVar1;
  uchar local_188 [8];
  uchar y [32];
  uchar x [32];
  undefined1 local_140 [8];
  secp256k1_scalar s;
  secp256k1_ge pt;
  secp256k1_gej res;
  int overflow;
  int ret;
  void *data_local;
  secp256k1_ecdh_hash_function hashfp_local;
  uchar *scalar_local;
  secp256k1_pubkey *point_local;
  uchar *output_local;
  secp256k1_context *ctx_local;
  
  res._124_4_ = 0;
  res.infinity = 0;
  if (output == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"output != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (point == (secp256k1_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"point != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (scalar == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"scalar != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    data_local = hashfp;
    if (hashfp == (secp256k1_ecdh_hash_function)0x0) {
      data_local = ecdh_hash_function_sha256;
    }
    secp256k1_pubkey_load(ctx,(secp256k1_ge *)(s.d + 3),point);
    secp256k1_scalar_set_b32((secp256k1_scalar *)local_140,scalar,&res.infinity);
    uVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)local_140);
    res.infinity = uVar1 | res.infinity;
    secp256k1_scalar_cmov((secp256k1_scalar *)local_140,&secp256k1_scalar_one,res.infinity);
    secp256k1_ecmult_const
              ((secp256k1_gej *)&pt.infinity,(secp256k1_ge *)(s.d + 3),(secp256k1_scalar *)local_140
               ,0x100);
    secp256k1_ge_set_gej((secp256k1_ge *)(s.d + 3),(secp256k1_gej *)&pt.infinity);
    secp256k1_fe_normalize((secp256k1_fe *)(s.d + 3));
    secp256k1_fe_normalize((secp256k1_fe *)(pt.x.n + 4));
    secp256k1_fe_get_b32(y + 0x18,(secp256k1_fe *)(s.d + 3));
    secp256k1_fe_get_b32(local_188,(secp256k1_fe *)(pt.x.n + 4));
    res._124_4_ = (*(code *)data_local)(output,y + 0x18,local_188,data);
    memset(y + 0x18,0,0x20);
    memset(local_188,0,0x20);
    secp256k1_scalar_clear((secp256k1_scalar *)local_140);
    ctx_local._4_4_ = (uint)(res._124_4_ != 0 & (res.infinity != 0 ^ 0xffU) & 1);
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ecdh(const secp256k1_context* ctx, unsigned char *output, const secp256k1_pubkey *point, const unsigned char *scalar, secp256k1_ecdh_hash_function hashfp, void *data) {
    int ret = 0;
    int overflow = 0;
    secp256k1_gej res;
    secp256k1_ge pt;
    secp256k1_scalar s;
    unsigned char x[32];
    unsigned char y[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(point != NULL);
    ARG_CHECK(scalar != NULL);

    if (hashfp == NULL) {
        hashfp = secp256k1_ecdh_hash_function_default;
    }

    secp256k1_pubkey_load(ctx, &pt, point);
    secp256k1_scalar_set_b32(&s, scalar, &overflow);

    overflow |= secp256k1_scalar_is_zero(&s);
    secp256k1_scalar_cmov(&s, &secp256k1_scalar_one, overflow);

    secp256k1_ecmult_const(&res, &pt, &s, 256);
    secp256k1_ge_set_gej(&pt, &res);

    /* Compute a hash of the point */
    secp256k1_fe_normalize(&pt.x);
    secp256k1_fe_normalize(&pt.y);
    secp256k1_fe_get_b32(x, &pt.x);
    secp256k1_fe_get_b32(y, &pt.y);

    ret = hashfp(output, x, y, data);

    memset(x, 0, 32);
    memset(y, 0, 32);
    secp256k1_scalar_clear(&s);

    return !!ret & !overflow;
}